

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlaneInfo::Read(ON_ClippingPlaneInfo *this,ON_BinaryArchive *file)

{
  bool bVar1;
  double local_38;
  double d;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_ClippingPlaneInfo *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (!bVar1) {
    return false;
  }
  d._7_1_ = iStack_24 == 1;
  if (((((bool)d._7_1_) &&
       (d._7_1_ = ON_BinaryArchive::ReadPlaneEquation(_minor_version,&this->m_plane_equation),
       (bool)d._7_1_)) &&
      (d._7_1_ = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plane_id), (bool)d._7_1_)) &&
     (d._7_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bEnabled), (bool)d._7_1_)) {
    if (0 < local_28) {
      local_38 = 0.0;
      d._7_1_ = ON_BinaryArchive::ReadDouble(_minor_version,&local_38);
      if (!(bool)d._7_1_) goto LAB_007c9d7b;
      if ((local_28 == 1) || (local_28 == 2)) {
        if ((local_38 < 0.0) || ((local_38 == 1.2343210235867887e+38 && (!NAN(local_38))))) {
          this->m_depth_enabled = false;
          local_38 = 0.0;
        }
        else {
          this->m_depth_enabled = true;
        }
      }
      SetDepth(this,local_38);
    }
    if (2 < local_28) {
      d._7_1_ = ON_BinaryArchive::ReadBool(_minor_version,&this->m_depth_enabled);
    }
  }
LAB_007c9d7b:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    d._7_1_ = 0;
  }
  return (bool)(d._7_1_ & 1);
}

Assistant:

bool ON_ClippingPlaneInfo::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = file.ReadPlaneEquation(m_plane_equation);
    if (!rc) break;

    rc = file.ReadUuid(m_plane_id);
    if (!rc) break;

    rc = file.ReadBool(&m_bEnabled);
    if (!rc) break;

    if (minor_version > 0)
    {
      double d = 0;
      rc = file.ReadDouble(&d);
      if (!rc) break;

      if (1 == minor_version || 2 == minor_version)
      {
        if (d >= 0.0 && d != ON_UNSET_POSITIVE_FLOAT)
        {
          m_depth_enabled = true;
        }
        else
        {
          m_depth_enabled = false;
          d = 0.0;
        }
      }
      SetDepth(d);
    }

    if (minor_version >= 3)
    {
      rc = file.ReadBool(&m_depth_enabled);
      if (!rc) break;
    }

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}